

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

back_insert_iterator<fmt::v8::detail::buffer<char32_t>_>
fmt::v8::detail::
write_significand<char32_t,std::back_insert_iterator<fmt::v8::detail::buffer<char32_t>>,unsigned_long,fmt::v8::detail::digit_grouping<char32_t>>
          (back_insert_iterator<fmt::v8::detail::buffer<char32_t>_> out,unsigned_long significand,
          int significand_size,int exponent,digit_grouping<char32_t> *grouping)

{
  basic_string_view<char> digits;
  back_insert_iterator<fmt::v8::detail::buffer<char32_t>_> bVar1;
  format_decimal_result<std::back_insert_iterator<fmt::v8::detail::buffer<char32_t>_>_> fVar2;
  memory_buffer buffer;
  char local_231;
  basic_memory_buffer<char,_500UL,_std::allocator<char>_> local_230;
  
  if ((grouping->sep_).thousands_sep == L'\0') {
    fVar2 = format_decimal<char32_t,_unsigned_long,_std::back_insert_iterator<fmt::v8::detail::buffer<char32_t>_>,_0>
                      (out,significand,significand_size);
    local_230.super_buffer<char>._vptr_buffer =
         (_func_int **)CONCAT44(local_230.super_buffer<char>._vptr_buffer._4_4_,0x30);
    bVar1 = fill_n<std::back_insert_iterator<fmt::v8::detail::buffer<char32_t>>,int,char32_t>
                      (fVar2.end.container,exponent,(char32_t *)&local_230);
  }
  else {
    local_230.super_buffer<char>.ptr_ = local_230.store_;
    local_230.super_buffer<char>.size_ = 0;
    local_230.super_buffer<char>._vptr_buffer = (_func_int **)&PTR_grow_001e6920;
    local_230.super_buffer<char>.capacity_ = 500;
    format_decimal<char,_unsigned_long,_fmt::v8::appender,_0>
              ((appender)&local_230,significand,significand_size);
    local_231 = '0';
    fill_n<fmt::v8::appender,int,char>((appender)&local_230,exponent,&local_231);
    digits.size_ = local_230.super_buffer<char>.size_;
    digits.data_ = local_230.super_buffer<char>.ptr_;
    bVar1 = digit_grouping<char32_t>::
            apply<std::back_insert_iterator<fmt::v8::detail::buffer<char32_t>>,char>
                      (grouping,out,digits);
    basic_memory_buffer<char,_500UL,_std::allocator<char>_>::~basic_memory_buffer(&local_230);
  }
  return (back_insert_iterator<fmt::v8::detail::buffer<char32_t>_>)bVar1.container;
}

Assistant:

FMT_CONSTEXPR20 auto write_significand(OutputIt out, T significand,
                                       int significand_size, int exponent,
                                       const Grouping& grouping) -> OutputIt {
  if (!grouping.separator()) {
    out = write_significand<Char>(out, significand, significand_size);
    return detail::fill_n(out, exponent, static_cast<Char>('0'));
  }
  auto buffer = memory_buffer();
  write_significand<char>(appender(buffer), significand, significand_size);
  detail::fill_n(appender(buffer), exponent, '0');
  return grouping.apply(out, string_view(buffer.data(), buffer.size()));
}